

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred_ssse3_intr.c
# Opt level: O0

void ihevc_weighted_pred_bi_ssse3
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 wgt0,WORD32 off0,WORD32 wgt1,WORD32 off1,WORD32 shift,
               WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar30;
  int iVar31;
  int in_ECX;
  undefined8 *in_RDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  int in_R8D;
  int in_R9D;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  WORD32 dst1;
  WORD32 dst0;
  __m128i res_temp8_4x32b;
  __m128i res_temp7_4x32b;
  __m128i res_temp6_4x32b;
  __m128i res_temp5_4x32b;
  __m128i res_temp4_4x32b;
  __m128i res_temp3_4x32b;
  __m128i res_temp2_4x32b;
  __m128i res_temp1_4x32b;
  __m128i wgt1_8x16b;
  __m128i wgt0_8x16b;
  __m128i lvl_shift2_4x32b;
  __m128i lvl_shift1_4x32b;
  __m128i const_temp_4x32b;
  __m128i src_temp4_8x16b;
  __m128i src_temp3_8x16b;
  __m128i src_temp2_8x16b;
  __m128i src_temp1_8x16b;
  WORD32 temp;
  WORD32 col;
  WORD32 row;
  undefined2 uStack_ba4;
  undefined2 uStack_ba2;
  undefined2 uStack_b9c;
  undefined2 uStack_b9a;
  undefined2 uStack_b94;
  undefined2 uStack_b92;
  undefined2 uStack_b8c;
  undefined2 uStack_b8a;
  undefined2 uStack_b84;
  undefined2 uStack_b82;
  undefined2 uStack_b7c;
  undefined2 uStack_b7a;
  undefined2 uStack_b74;
  undefined2 uStack_b72;
  undefined2 uStack_b6c;
  undefined2 uStack_b6a;
  undefined4 local_b68;
  short sStack_b64;
  undefined2 uStack_b62;
  short sStack_b60;
  undefined2 uStack_b5e;
  short sStack_b5c;
  undefined2 uStack_b5a;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined4 local_b48;
  short sStack_b44;
  undefined2 uStack_b42;
  short sStack_b40;
  undefined2 uStack_b3e;
  short sStack_b3c;
  undefined2 uStack_b3a;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined4 uStack_b00;
  short sStack_afc;
  undefined2 uStack_afa;
  undefined4 uStack_af0;
  short sStack_aec;
  undefined2 uStack_aea;
  int local_a8c;
  int local_a88;
  undefined8 *local_a78;
  undefined1 (*local_a70) [16];
  undefined1 (*local_a68) [16];
  short local_a48;
  short sStack_a46;
  short sStack_a44;
  short sStack_a42;
  short sStack_a40;
  short sStack_a3e;
  short sStack_a3c;
  short sStack_a3a;
  short local_a28;
  short sStack_a26;
  short sStack_a24;
  short sStack_a22;
  short sStack_a20;
  short sStack_a1e;
  short sStack_a1c;
  short sStack_a1a;
  short local_a08;
  short sStack_a06;
  short sStack_a04;
  short sStack_a02;
  short sStack_a00;
  short sStack_9fe;
  short sStack_9fc;
  short sStack_9fa;
  short local_9e8;
  short sStack_9e6;
  short sStack_9e4;
  short sStack_9e2;
  short sStack_9e0;
  short sStack_9de;
  short sStack_9dc;
  short sStack_9da;
  short local_9c8;
  short sStack_9c6;
  short sStack_9c4;
  short sStack_9c2;
  short sStack_9c0;
  short sStack_9be;
  short sStack_9bc;
  short sStack_9ba;
  short local_9a8;
  short sStack_9a6;
  short sStack_9a4;
  short sStack_9a2;
  short sStack_9a0;
  short sStack_99e;
  short sStack_99c;
  short sStack_99a;
  undefined2 local_848;
  undefined2 uStack_846;
  undefined2 uStack_844;
  undefined2 uStack_842;
  undefined2 local_828;
  undefined2 uStack_826;
  undefined2 uStack_824;
  undefined2 uStack_822;
  undefined2 local_808;
  undefined2 uStack_806;
  undefined2 uStack_804;
  undefined2 uStack_802;
  undefined2 local_7e8;
  undefined2 uStack_7e6;
  undefined2 uStack_7e4;
  undefined2 uStack_7e2;
  undefined2 local_7c8;
  undefined2 uStack_7c6;
  undefined2 uStack_7c4;
  undefined2 uStack_7c2;
  undefined2 local_7a8;
  undefined2 uStack_7a6;
  undefined2 uStack_7a4;
  undefined2 uStack_7a2;
  undefined2 local_788;
  undefined2 uStack_786;
  undefined2 uStack_784;
  undefined2 uStack_782;
  undefined2 local_768;
  undefined2 uStack_766;
  undefined2 uStack_764;
  undefined2 uStack_762;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  int iStack_634;
  int iStack_62c;
  int iStack_614;
  int iStack_60c;
  int iStack_604;
  int iStack_5fc;
  int iStack_5f4;
  int iStack_5ec;
  int iStack_5e4;
  int iStack_5dc;
  int iStack_5d4;
  int iStack_5cc;
  int iStack_534;
  int iStack_530;
  int iStack_52c;
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  int iStack_504;
  int iStack_4f4;
  int iStack_4f0;
  int iStack_4ec;
  int iStack_4e4;
  int iStack_4d4;
  int iStack_4d0;
  int iStack_4cc;
  int iStack_4b4;
  int iStack_4ac;
  int iStack_494;
  int iStack_48c;
  int iStack_47c;
  int iStack_474;
  int iStack_46c;
  int iStack_45c;
  int iStack_454;
  int iStack_44c;
  undefined2 uStack_420;
  undefined2 uStack_41e;
  undefined2 uStack_41c;
  undefined2 uStack_41a;
  undefined2 uStack_400;
  undefined2 uStack_3fe;
  undefined2 uStack_3fc;
  undefined2 uStack_3fa;
  undefined2 uStack_3e0;
  undefined2 uStack_3de;
  undefined2 uStack_3dc;
  undefined2 uStack_3da;
  undefined2 uStack_3c0;
  undefined2 uStack_3be;
  undefined2 uStack_3bc;
  undefined2 uStack_3ba;
  undefined2 uStack_3a0;
  undefined2 uStack_39e;
  undefined2 uStack_39c;
  undefined2 uStack_39a;
  undefined2 uStack_380;
  undefined2 uStack_37e;
  undefined2 uStack_37c;
  undefined2 uStack_37a;
  int iStack_314;
  int iStack_30c;
  int iStack_2f4;
  int iStack_2ec;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  
  if ((int)(uint)res_temp5_4x32b[1] % 4 != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                  ,0x2f7,
                  "void ihevc_weighted_pred_bi_ssse3(WORD16 *, WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if ((int)res_temp5_4x32b[0] % 4 != 0) {
    __assert_fail("(ht % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                  ,0x2f8,
                  "void ihevc_weighted_pred_bi_ssse3(WORD16 *, WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  iVar31 = (int)res_temp8_4x32b[0] + 1 + (int)res_temp7_4x32b[0] <<
           ((char)res_temp7_4x32b[1] - 1U & 0x1f);
  auVar39._2_2_ = (short)res_temp6_4x32b[0];
  auVar39._0_2_ = (short)res_temp6_4x32b[0];
  auVar39._4_2_ = (short)res_temp6_4x32b[0];
  auVar39._6_2_ = (short)res_temp6_4x32b[0];
  auVar39._10_2_ = (short)res_temp6_4x32b[0];
  auVar39._8_2_ = (short)res_temp6_4x32b[0];
  auVar39._12_2_ = (short)res_temp6_4x32b[0];
  auVar39._14_2_ = (short)res_temp6_4x32b[0];
  uVar7 = CONCAT26((short)dst1,CONCAT24((short)dst1,CONCAT22((short)dst1,(short)dst1)));
  uVar9 = CONCAT26((short)dst1,CONCAT24((short)dst1,CONCAT22((short)dst1,(short)dst1)));
  auVar38._2_2_ = (short)res_temp6_4x32b[1];
  auVar38._0_2_ = (short)res_temp6_4x32b[1];
  auVar38._4_2_ = (short)res_temp6_4x32b[1];
  auVar38._6_2_ = (short)res_temp6_4x32b[1];
  auVar38._10_2_ = (short)res_temp6_4x32b[1];
  auVar38._8_2_ = (short)res_temp6_4x32b[1];
  auVar38._12_2_ = (short)res_temp6_4x32b[1];
  auVar38._14_2_ = (short)res_temp6_4x32b[1];
  uVar8 = CONCAT26((short)res_temp8_4x32b[1],
                   CONCAT24((short)res_temp8_4x32b[1],
                            CONCAT22((short)res_temp8_4x32b[1],(short)res_temp8_4x32b[1])));
  uVar10 = CONCAT26((short)res_temp8_4x32b[1],
                    CONCAT24((short)res_temp8_4x32b[1],
                             CONCAT22((short)res_temp8_4x32b[1],(short)res_temp8_4x32b[1])));
  auVar36._8_8_ = uVar9;
  auVar36._0_8_ = uVar7;
  auVar36 = pmulhw(auVar39,auVar36);
  auVar37._8_8_ = uVar10;
  auVar37._0_8_ = uVar8;
  auVar37 = pmulhw(auVar38,auVar37);
  local_768 = auVar36._0_2_;
  uStack_766 = auVar36._2_2_;
  uStack_764 = auVar36._4_2_;
  uStack_762 = auVar36._6_2_;
  iVar29 = CONCAT22(local_768,(short)res_temp6_4x32b[0] * (short)dst1);
  uStack_af0 = CONCAT22(uStack_764,(short)res_temp6_4x32b[0] * (short)dst1);
  _uStack_af0 = CONCAT26(uStack_762,CONCAT24((short)res_temp6_4x32b[0] * (short)dst1,uStack_af0));
  local_788 = auVar37._0_2_;
  uStack_786 = auVar37._2_2_;
  uStack_784 = auVar37._4_2_;
  uStack_782 = auVar37._6_2_;
  iVar30 = CONCAT22(local_788,(short)res_temp6_4x32b[1] * (short)res_temp8_4x32b[1]);
  uStack_b00 = CONCAT22(uStack_784,(short)res_temp6_4x32b[1] * (short)res_temp8_4x32b[1]);
  _uStack_b00 = CONCAT26(uStack_782,
                         CONCAT24((short)res_temp6_4x32b[1] * (short)res_temp8_4x32b[1],uStack_b00))
  ;
  iStack_4e4 = (int)(CONCAT26(uStack_766,CONCAT24((short)res_temp6_4x32b[0] * (short)dst1,iVar29))
                    >> 0x20);
  iStack_504 = (int)(CONCAT26(uStack_786,
                              CONCAT24((short)res_temp6_4x32b[1] * (short)res_temp8_4x32b[1],iVar30)
                             ) >> 0x20);
  iStack_45c = (int)((ulong)_uStack_af0 >> 0x20);
  iStack_47c = (int)((ulong)_uStack_b00 >> 0x20);
  local_a78 = in_RDX;
  local_a70 = in_RSI;
  local_a68 = in_RDI;
  if (((uint)res_temp5_4x32b[1] & 7) == 0) {
    for (local_a88 = 0; local_a88 < (int)res_temp5_4x32b[0]; local_a88 = local_a88 + 2) {
      for (local_a8c = 0; local_a8c < (int)(uint)res_temp5_4x32b[1]; local_a8c = local_a8c + 8) {
        uVar3 = *(undefined8 *)*local_a68;
        uVar4 = *(undefined8 *)(*local_a68 + 8);
        uVar5 = *(undefined8 *)*local_a70;
        uVar6 = *(undefined8 *)(*local_a70 + 8);
        pauVar1 = (undefined1 (*) [16])(*local_a68 + (long)in_ECX * 2);
        uVar11 = *(undefined8 *)*pauVar1;
        uVar12 = *(undefined8 *)(*pauVar1 + 8);
        pauVar2 = (undefined1 (*) [16])(*local_a70 + (long)in_R8D * 2);
        uVar13 = *(undefined8 *)*pauVar2;
        uVar14 = *(undefined8 *)(*pauVar2 + 8);
        local_9a8 = (short)uVar3;
        sStack_9a6 = (short)((ulong)uVar3 >> 0x10);
        sStack_9a4 = (short)((ulong)uVar3 >> 0x20);
        sStack_9a2 = (short)((ulong)uVar3 >> 0x30);
        sStack_9a0 = (short)uVar4;
        sStack_99e = (short)((ulong)uVar4 >> 0x10);
        sStack_99c = (short)((ulong)uVar4 >> 0x20);
        sStack_99a = (short)((ulong)uVar4 >> 0x30);
        local_9c8 = (short)uVar5;
        sStack_9c6 = (short)((ulong)uVar5 >> 0x10);
        sStack_9c4 = (short)((ulong)uVar5 >> 0x20);
        sStack_9c2 = (short)((ulong)uVar5 >> 0x30);
        sStack_9c0 = (short)uVar6;
        sStack_9be = (short)((ulong)uVar6 >> 0x10);
        sStack_9bc = (short)((ulong)uVar6 >> 0x20);
        sStack_9ba = (short)((ulong)uVar6 >> 0x30);
        local_9e8 = (short)uVar11;
        sStack_9e6 = (short)((ulong)uVar11 >> 0x10);
        sStack_9e4 = (short)((ulong)uVar11 >> 0x20);
        sStack_9e2 = (short)((ulong)uVar11 >> 0x30);
        sStack_9e0 = (short)uVar12;
        sStack_9de = (short)((ulong)uVar12 >> 0x10);
        sStack_9dc = (short)((ulong)uVar12 >> 0x20);
        sStack_9da = (short)((ulong)uVar12 >> 0x30);
        local_a08 = (short)uVar13;
        sStack_a06 = (short)((ulong)uVar13 >> 0x10);
        sStack_a04 = (short)((ulong)uVar13 >> 0x20);
        sStack_a02 = (short)((ulong)uVar13 >> 0x30);
        sStack_a00 = (short)uVar14;
        sStack_9fe = (short)((ulong)uVar14 >> 0x10);
        sStack_9fc = (short)((ulong)uVar14 >> 0x20);
        sStack_9fa = (short)((ulong)uVar14 >> 0x30);
        auVar22._8_8_ = uVar9;
        auVar22._0_8_ = uVar7;
        auVar37 = pmulhw(*local_a68,auVar22);
        auVar21._8_8_ = uVar10;
        auVar21._0_8_ = uVar8;
        auVar38 = pmulhw(*local_a70,auVar21);
        auVar20._8_8_ = uVar9;
        auVar20._0_8_ = uVar7;
        auVar36 = pmulhw(*pauVar1,auVar20);
        auVar19._8_8_ = uVar10;
        auVar19._0_8_ = uVar8;
        auVar39 = pmulhw(*pauVar2,auVar19);
        uStack_380 = auVar37._8_2_;
        uStack_37e = auVar37._10_2_;
        uStack_37c = auVar37._12_2_;
        uStack_37a = auVar37._14_2_;
        uStack_3a0 = auVar38._8_2_;
        uStack_39e = auVar38._10_2_;
        uStack_39c = auVar38._12_2_;
        uStack_39a = auVar38._14_2_;
        uStack_3c0 = auVar36._8_2_;
        uStack_3be = auVar36._10_2_;
        uStack_3bc = auVar36._12_2_;
        uStack_3ba = auVar36._14_2_;
        uStack_3e0 = auVar39._8_2_;
        uStack_3de = auVar39._10_2_;
        uStack_3dc = auVar39._12_2_;
        uStack_3da = auVar39._14_2_;
        local_7a8 = auVar37._0_2_;
        uStack_7a6 = auVar37._2_2_;
        uStack_7a4 = auVar37._4_2_;
        uStack_7a2 = auVar37._6_2_;
        local_b38._0_4_ = CONCAT22(local_7a8,local_9a8 * (short)dst1);
        local_b38._0_6_ = CONCAT24(sStack_9a6 * (short)dst1,(int)local_b38);
        local_b38 = CONCAT26(uStack_7a6,(undefined6)local_b38);
        uStack_b30._0_2_ = sStack_9a4 * (short)dst1;
        uStack_b30._2_2_ = uStack_7a4;
        uStack_b30._4_2_ = sStack_9a2 * (short)dst1;
        uStack_b30._6_2_ = uStack_7a2;
        local_7c8 = auVar38._0_2_;
        uStack_7c6 = auVar38._2_2_;
        uStack_7c4 = auVar38._4_2_;
        uStack_7c2 = auVar38._6_2_;
        local_b48 = CONCAT22(local_7c8,local_9c8 * (short)res_temp8_4x32b[1]);
        _local_b48 = CONCAT24(sStack_9c6 * (short)res_temp8_4x32b[1],local_b48);
        _local_b48 = CONCAT26(uStack_7c6,_local_b48);
        sStack_b40 = sStack_9c4 * (short)res_temp8_4x32b[1];
        uStack_b3e = uStack_7c4;
        sStack_b3c = sStack_9c2 * (short)res_temp8_4x32b[1];
        uStack_b3a = uStack_7c2;
        local_7e8 = auVar36._0_2_;
        uStack_7e6 = auVar36._2_2_;
        uStack_7e4 = auVar36._4_2_;
        uStack_7e2 = auVar36._6_2_;
        local_b58._0_4_ = CONCAT22(local_7e8,local_9e8 * (short)dst1);
        local_b58._0_6_ = CONCAT24(sStack_9e6 * (short)dst1,(int)local_b58);
        local_b58 = CONCAT26(uStack_7e6,(undefined6)local_b58);
        uStack_b50._0_2_ = sStack_9e4 * (short)dst1;
        uStack_b50._2_2_ = uStack_7e4;
        uStack_b50._4_2_ = sStack_9e2 * (short)dst1;
        uStack_b50._6_2_ = uStack_7e2;
        local_808 = auVar39._0_2_;
        uStack_806 = auVar39._2_2_;
        uStack_804 = auVar39._4_2_;
        uStack_802 = auVar39._6_2_;
        local_b68 = CONCAT22(local_808,local_a08 * (short)res_temp8_4x32b[1]);
        _local_b68 = CONCAT24(sStack_a06 * (short)res_temp8_4x32b[1],local_b68);
        _local_b68 = CONCAT26(uStack_806,_local_b68);
        sStack_b60 = sStack_a04 * (short)res_temp8_4x32b[1];
        uStack_b5e = uStack_804;
        sStack_b5c = sStack_a02 * (short)res_temp8_4x32b[1];
        uStack_b5a = uStack_802;
        iVar32 = CONCAT22(uStack_380,sStack_9a0 * (short)dst1);
        iVar40 = CONCAT22(uStack_37c,sStack_99c * (short)dst1);
        iStack_454 = (int)(CONCAT26(uStack_37e,CONCAT24(sStack_99e * (short)dst1,iVar32)) >> 0x20);
        iStack_44c = (int)(CONCAT26(uStack_37a,CONCAT24(sStack_99a * (short)dst1,iVar40)) >> 0x20);
        iVar32 = iVar32 + iVar29;
        iVar40 = iVar40 + uStack_af0;
        uStack_b74 = (undefined2)(iStack_454 + iStack_4e4);
        uStack_b72 = (undefined2)((uint)(iStack_454 + iStack_4e4) >> 0x10);
        uStack_b6c = (undefined2)(iStack_44c + iStack_45c);
        uStack_b6a = (undefined2)((uint)(iStack_44c + iStack_45c) >> 0x10);
        iVar33 = CONCAT22(uStack_3a0,sStack_9c0 * (short)res_temp8_4x32b[1]);
        iVar41 = CONCAT22(uStack_39c,sStack_9bc * (short)res_temp8_4x32b[1]);
        iStack_474 = (int)(CONCAT26(uStack_39e,
                                    CONCAT24(sStack_9be * (short)res_temp8_4x32b[1],iVar33)) >> 0x20
                          );
        iStack_46c = (int)(CONCAT26(uStack_39a,
                                    CONCAT24(sStack_9ba * (short)res_temp8_4x32b[1],iVar41)) >> 0x20
                          );
        iVar33 = iVar33 + iVar30;
        iVar41 = iVar41 + uStack_b00;
        uStack_b84 = (undefined2)(iStack_474 + iStack_504);
        uStack_b82 = (undefined2)((uint)(iStack_474 + iStack_504) >> 0x10);
        uStack_b7c = (undefined2)(iStack_46c + iStack_47c);
        uStack_b7a = (undefined2)((uint)(iStack_46c + iStack_47c) >> 0x10);
        iVar34 = CONCAT22(uStack_3c0,sStack_9e0 * (short)dst1);
        iVar42 = CONCAT22(uStack_3bc,sStack_9dc * (short)dst1);
        iStack_494 = (int)(CONCAT26(uStack_3be,CONCAT24(sStack_9de * (short)dst1,iVar34)) >> 0x20);
        iStack_48c = (int)(CONCAT26(uStack_3ba,CONCAT24(sStack_9da * (short)dst1,iVar42)) >> 0x20);
        iVar34 = iVar34 + iVar29;
        iVar42 = iVar42 + uStack_af0;
        uStack_b94 = (undefined2)(iStack_494 + iStack_4e4);
        uStack_b92 = (undefined2)((uint)(iStack_494 + iStack_4e4) >> 0x10);
        uStack_b8c = (undefined2)(iStack_48c + iStack_45c);
        uStack_b8a = (undefined2)((uint)(iStack_48c + iStack_45c) >> 0x10);
        iVar35 = CONCAT22(uStack_3e0,sStack_a00 * (short)res_temp8_4x32b[1]);
        iVar43 = CONCAT22(uStack_3dc,sStack_9fc * (short)res_temp8_4x32b[1]);
        iStack_4b4 = (int)(CONCAT26(uStack_3de,
                                    CONCAT24(sStack_9fe * (short)res_temp8_4x32b[1],iVar35)) >> 0x20
                          );
        iStack_4ac = (int)(CONCAT26(uStack_3da,
                                    CONCAT24(sStack_9fa * (short)res_temp8_4x32b[1],iVar43)) >> 0x20
                          );
        iVar35 = iVar35 + iVar30;
        iVar43 = iVar43 + uStack_b00;
        uStack_ba4 = (undefined2)(iStack_4b4 + iStack_504);
        uStack_ba2 = (undefined2)((uint)(iStack_4b4 + iStack_504) >> 0x10);
        uStack_b9c = (undefined2)(iStack_4ac + iStack_47c);
        uStack_b9a = (undefined2)((uint)(iStack_4ac + iStack_47c) >> 0x10);
        iStack_4d4 = (int)((ulong)local_b38 >> 0x20);
        iStack_4d0 = local_b38._8_4_;
        iStack_4cc = local_b38._12_4_;
        iStack_4f4 = (int)((ulong)_local_b48 >> 0x20);
        iStack_4f0 = local_b48._8_4_;
        iStack_4ec = local_b48._12_4_;
        iStack_514 = (int)((ulong)local_b58 >> 0x20);
        iStack_510 = local_b58._8_4_;
        iStack_50c = local_b58._12_4_;
        iStack_534 = (int)((ulong)_local_b68 >> 0x20);
        iStack_530 = local_b68._8_4_;
        iStack_52c = local_b68._12_4_;
        auVar37 = ZEXT416((uint)res_temp7_4x32b[1]);
        local_b38 = CONCAT44(iStack_4d4 + iStack_4e4 + iStack_4f4 + iStack_504 + iVar31 >> auVar37,
                             (int)local_b38 + iVar29 + local_b48 + iVar30 + iVar31 >> auVar37);
        uStack_b30._0_4_ = iStack_4d0 + uStack_af0 + iStack_4f0 + uStack_b00 + iVar31 >> auVar37;
        uStack_b30._4_4_ = iStack_4cc + iStack_45c + iStack_4ec + iStack_47c + iVar31 >> auVar37;
        auVar37 = ZEXT416((uint)res_temp7_4x32b[1]);
        local_b58 = CONCAT44(iStack_514 + iStack_4e4 + iStack_534 + iStack_504 + iVar31 >> auVar37,
                             (int)local_b58 + iVar29 + local_b68 + iVar30 + iVar31 >> auVar37);
        uStack_b50._0_4_ = iStack_510 + uStack_af0 + iStack_530 + uStack_b00 + iVar31 >> auVar37;
        uStack_b50._4_4_ = iStack_50c + iStack_45c + iStack_52c + iStack_47c + iVar31 >> auVar37;
        iStack_5d4 = (int)(CONCAT26(uStack_b72,CONCAT24(uStack_b74,iVar32)) >> 0x20);
        iStack_5cc = (int)(CONCAT26(uStack_b6a,CONCAT24(uStack_b6c,iVar40)) >> 0x20);
        iStack_5e4 = (int)(CONCAT26(uStack_b82,CONCAT24(uStack_b84,iVar33)) >> 0x20);
        iStack_5dc = (int)(CONCAT26(uStack_b7a,CONCAT24(uStack_b7c,iVar41)) >> 0x20);
        iVar32 = iVar32 + iVar33;
        iVar40 = iVar40 + iVar41;
        uStack_b74 = (undefined2)(iStack_5d4 + iStack_5e4);
        uStack_b72 = (undefined2)((uint)(iStack_5d4 + iStack_5e4) >> 0x10);
        uStack_b6c = (undefined2)(iStack_5cc + iStack_5dc);
        uStack_b6a = (undefined2)((uint)(iStack_5cc + iStack_5dc) >> 0x10);
        iStack_5f4 = (int)(CONCAT26(uStack_b92,CONCAT24(uStack_b94,iVar34)) >> 0x20);
        iStack_5ec = (int)(CONCAT26(uStack_b8a,CONCAT24(uStack_b8c,iVar42)) >> 0x20);
        iStack_604 = (int)(CONCAT26(uStack_ba2,CONCAT24(uStack_ba4,iVar35)) >> 0x20);
        iStack_5fc = (int)(CONCAT26(uStack_b9a,CONCAT24(uStack_b9c,iVar43)) >> 0x20);
        iVar34 = iVar34 + iVar35;
        iVar42 = iVar42 + iVar43;
        uStack_b94 = (undefined2)(iStack_5f4 + iStack_604);
        uStack_b92 = (undefined2)((uint)(iStack_5f4 + iStack_604) >> 0x10);
        uStack_b8c = (undefined2)(iStack_5ec + iStack_5fc);
        uStack_b8a = (undefined2)((uint)(iStack_5ec + iStack_5fc) >> 0x10);
        iStack_614 = (int)(CONCAT26(uStack_b72,CONCAT24(uStack_b74,iVar32)) >> 0x20);
        iStack_60c = (int)(CONCAT26(uStack_b6a,CONCAT24(uStack_b6c,iVar40)) >> 0x20);
        iVar32 = iVar32 + iVar31;
        iVar40 = iVar40 + iVar31;
        uStack_b74 = (undefined2)(iStack_614 + iVar31);
        uStack_b72 = (undefined2)((uint)(iStack_614 + iVar31) >> 0x10);
        uStack_b6c = (undefined2)(iStack_60c + iVar31);
        uStack_b6a = (undefined2)((uint)(iStack_60c + iVar31) >> 0x10);
        iStack_634 = (int)(CONCAT26(uStack_b92,CONCAT24(uStack_b94,iVar34)) >> 0x20);
        iStack_62c = (int)(CONCAT26(uStack_b8a,CONCAT24(uStack_b8c,iVar42)) >> 0x20);
        iVar34 = iVar34 + iVar31;
        iVar42 = iVar42 + iVar31;
        uStack_b94 = (undefined2)(iStack_634 + iVar31);
        uStack_b92 = (undefined2)((uint)(iStack_634 + iVar31) >> 0x10);
        uStack_b8c = (undefined2)(iStack_62c + iVar31);
        uStack_b8a = (undefined2)((uint)(iStack_62c + iVar31) >> 0x10);
        iStack_2f4 = (int)(CONCAT26(uStack_b72,CONCAT24(uStack_b74,iVar32)) >> 0x20);
        iStack_2ec = (int)(CONCAT26(uStack_b6a,CONCAT24(uStack_b6c,iVar40)) >> 0x20);
        auVar37 = ZEXT416((uint)res_temp7_4x32b[1]);
        uStack_b74 = (undefined2)(iStack_2f4 >> auVar37);
        uStack_b72 = (undefined2)((uint)(iStack_2f4 >> auVar37) >> 0x10);
        uStack_b6c = (undefined2)(iStack_2ec >> auVar37);
        uStack_b6a = (undefined2)((uint)(iStack_2ec >> auVar37) >> 0x10);
        iStack_314 = (int)(CONCAT26(uStack_b92,CONCAT24(uStack_b94,iVar34)) >> 0x20);
        iStack_30c = (int)(CONCAT26(uStack_b8a,CONCAT24(uStack_b8c,iVar42)) >> 0x20);
        auVar38 = ZEXT416((uint)res_temp7_4x32b[1]);
        uStack_b94 = (undefined2)(iStack_314 >> auVar38);
        uStack_b92 = (undefined2)((uint)(iStack_314 >> auVar38) >> 0x10);
        uStack_b8c = (undefined2)(iStack_30c >> auVar38);
        uStack_b8a = (undefined2)((uint)(iStack_30c >> auVar38) >> 0x10);
        auVar27._4_2_ = uStack_b74;
        auVar27._0_4_ = iVar32 >> auVar37;
        auVar27._6_2_ = uStack_b72;
        auVar27._12_2_ = uStack_b6c;
        auVar27._8_4_ = iVar40 >> auVar37;
        auVar27._14_2_ = uStack_b6a;
        auVar28._8_8_ = uStack_b30;
        auVar28._0_8_ = local_b38;
        auVar37 = packssdw(auVar28,auVar27);
        auVar25._4_2_ = uStack_b94;
        auVar25._0_4_ = iVar34 >> auVar38;
        auVar25._6_2_ = uStack_b92;
        auVar25._12_2_ = uStack_b8c;
        auVar25._8_4_ = iVar42 >> auVar38;
        auVar25._14_2_ = uStack_b8a;
        auVar26._8_8_ = uStack_b50;
        auVar26._0_8_ = local_b58;
        auVar38 = packssdw(auVar26,auVar25);
        local_1f8 = auVar37._0_2_;
        sStack_1f6 = auVar37._2_2_;
        sStack_1f4 = auVar37._4_2_;
        sStack_1f2 = auVar37._6_2_;
        sStack_1f0 = auVar37._8_2_;
        sStack_1ee = auVar37._10_2_;
        sStack_1ec = auVar37._12_2_;
        sStack_1ea = auVar37._14_2_;
        local_b38._0_2_ =
             CONCAT11((0 < sStack_1f6) * (sStack_1f6 < 0x100) * auVar37[2] - (0xff < sStack_1f6),
                      (0 < local_1f8) * (local_1f8 < 0x100) * auVar37[0] - (0xff < local_1f8));
        local_b38._0_3_ =
             CONCAT12((0 < sStack_1f4) * (sStack_1f4 < 0x100) * auVar37[4] - (0xff < sStack_1f4),
                      (undefined2)local_b38);
        local_b38._0_4_ =
             CONCAT13((0 < sStack_1f2) * (sStack_1f2 < 0x100) * auVar37[6] - (0xff < sStack_1f2),
                      (undefined3)local_b38);
        local_b38._0_5_ =
             CONCAT14((0 < sStack_1f0) * (sStack_1f0 < 0x100) * auVar37[8] - (0xff < sStack_1f0),
                      (int)local_b38);
        local_b38._0_6_ =
             CONCAT15((0 < sStack_1ee) * (sStack_1ee < 0x100) * auVar37[10] - (0xff < sStack_1ee),
                      (undefined5)local_b38);
        local_b38._0_7_ =
             CONCAT16((0 < sStack_1ec) * (sStack_1ec < 0x100) * auVar37[0xc] - (0xff < sStack_1ec),
                      (undefined6)local_b38);
        local_b38 = CONCAT17((0 < sStack_1ea) * (sStack_1ea < 0x100) * auVar37[0xe] -
                             (0xff < sStack_1ea),(undefined7)local_b38);
        local_218 = auVar38._0_2_;
        sStack_216 = auVar38._2_2_;
        sStack_214 = auVar38._4_2_;
        sStack_212 = auVar38._6_2_;
        sStack_210 = auVar38._8_2_;
        sStack_20e = auVar38._10_2_;
        sStack_20c = auVar38._12_2_;
        sStack_20a = auVar38._14_2_;
        local_b58._0_4_ =
             CONCAT13((0 < sStack_212) * (sStack_212 < 0x100) * auVar38[6] - (0xff < sStack_212),
                      CONCAT12((0 < sStack_214) * (sStack_214 < 0x100) * auVar38[4] -
                               (0xff < sStack_214),
                               CONCAT11((0 < sStack_216) * (sStack_216 < 0x100) * auVar38[2] -
                                        (0xff < sStack_216),
                                        (0 < local_218) * (local_218 < 0x100) * auVar38[0] -
                                        (0xff < local_218))));
        local_b58._0_6_ =
             CONCAT15((0 < sStack_20e) * (sStack_20e < 0x100) * auVar38[10] - (0xff < sStack_20e),
                      CONCAT14((0 < sStack_210) * (sStack_210 < 0x100) * auVar38[8] -
                               (0xff < sStack_210),(int)local_b58));
        local_b58 = CONCAT17((0 < sStack_20a) * (sStack_20a < 0x100) * auVar38[0xe] -
                             (0xff < sStack_20a),
                             CONCAT16((0 < sStack_20c) * (sStack_20c < 0x100) * auVar38[0xc] -
                                      (0xff < sStack_20c),(undefined6)local_b58));
        uVar3 = local_b58;
        *local_a78 = local_b38;
        local_b58._6_2_ = SUB82(uVar3,6);
        *(ulong *)((long)local_a78 + (long)in_R9D) =
             CONCAT26(local_b58._6_2_,CONCAT24(local_b58._4_2_,(int)local_b58));
        local_a68 = local_a68 + 1;
        local_a70 = local_a70 + 1;
        local_a78 = local_a78 + 1;
      }
      local_a68 = (undefined1 (*) [16])
                  ((long)local_a68 +
                  (long)(in_ECX << 1) * 2 + (long)(int)(uint)res_temp5_4x32b[1] * -2);
      local_a70 = (undefined1 (*) [16])
                  ((long)local_a70 +
                  (long)(in_R8D << 1) * 2 + (long)(int)(uint)res_temp5_4x32b[1] * -2);
      local_a78 = (undefined8 *)
                  ((long)local_a78 + ((long)(in_R9D << 1) - (long)(int)(uint)res_temp5_4x32b[1]));
    }
  }
  else {
    for (local_a88 = 0; local_a88 < (int)res_temp5_4x32b[0]; local_a88 = local_a88 + 2) {
      for (local_a8c = 0; local_a8c < (int)(uint)res_temp5_4x32b[1]; local_a8c = local_a8c + 4) {
        uVar3 = *(undefined8 *)*local_a68;
        uVar4 = *(undefined8 *)*local_a70;
        uVar5 = *(undefined8 *)(*local_a68 + (long)in_ECX * 2);
        uVar6 = *(undefined8 *)(*local_a70 + (long)in_R8D * 2);
        local_a28 = (short)uVar3;
        sStack_a26 = (short)((ulong)uVar3 >> 0x10);
        sStack_a24 = (short)((ulong)uVar3 >> 0x20);
        sStack_a22 = (short)((ulong)uVar3 >> 0x30);
        sStack_a20 = (short)uVar5;
        sStack_a1e = (short)((ulong)uVar5 >> 0x10);
        sStack_a1c = (short)((ulong)uVar5 >> 0x20);
        sStack_a1a = (short)((ulong)uVar5 >> 0x30);
        local_a48 = (short)uVar4;
        sStack_a46 = (short)((ulong)uVar4 >> 0x10);
        sStack_a44 = (short)((ulong)uVar4 >> 0x20);
        sStack_a42 = (short)((ulong)uVar4 >> 0x30);
        sStack_a40 = (short)uVar6;
        sStack_a3e = (short)((ulong)uVar6 >> 0x10);
        sStack_a3c = (short)((ulong)uVar6 >> 0x20);
        sStack_a3a = (short)((ulong)uVar6 >> 0x30);
        auVar18._8_8_ = uVar5;
        auVar18._0_8_ = uVar3;
        auVar17._8_8_ = uVar9;
        auVar17._0_8_ = uVar7;
        auVar37 = pmulhw(auVar18,auVar17);
        auVar16._8_8_ = uVar6;
        auVar16._0_8_ = uVar4;
        auVar15._8_8_ = uVar10;
        auVar15._0_8_ = uVar8;
        auVar38 = pmulhw(auVar16,auVar15);
        uStack_400 = auVar37._8_2_;
        uStack_3fe = auVar37._10_2_;
        uStack_3fc = auVar37._12_2_;
        uStack_3fa = auVar37._14_2_;
        local_b58._0_4_ = CONCAT22(uStack_400,sStack_a20 * (short)dst1);
        local_b58._0_6_ = CONCAT24(sStack_a1e * (short)dst1,(int)local_b58);
        local_b58 = CONCAT26(uStack_3fe,(undefined6)local_b58);
        uStack_b50._0_2_ = sStack_a1c * (short)dst1;
        uStack_b50._2_2_ = uStack_3fc;
        uStack_b50._4_2_ = sStack_a1a * (short)dst1;
        uStack_b50._6_2_ = uStack_3fa;
        uStack_420 = auVar38._8_2_;
        uStack_41e = auVar38._10_2_;
        uStack_41c = auVar38._12_2_;
        uStack_41a = auVar38._14_2_;
        local_b68 = CONCAT22(uStack_420,sStack_a40 * (short)res_temp8_4x32b[1]);
        _local_b68 = CONCAT24(sStack_a3e * (short)res_temp8_4x32b[1],local_b68);
        _local_b68 = CONCAT26(uStack_41e,_local_b68);
        sStack_b60 = sStack_a3c * (short)res_temp8_4x32b[1];
        uStack_b5e = uStack_41c;
        sStack_b5c = sStack_a3a * (short)res_temp8_4x32b[1];
        uStack_b5a = uStack_41a;
        local_828 = auVar37._0_2_;
        uStack_826 = auVar37._2_2_;
        uStack_824 = auVar37._4_2_;
        uStack_822 = auVar37._6_2_;
        local_b38._0_4_ = CONCAT22(local_828,local_a28 * (short)dst1);
        local_b38._0_6_ = CONCAT24(sStack_a26 * (short)dst1,(int)local_b38);
        local_b38 = CONCAT26(uStack_826,(undefined6)local_b38);
        uStack_b30._0_2_ = sStack_a24 * (short)dst1;
        uStack_b30._2_2_ = uStack_824;
        uStack_b30._4_2_ = sStack_a22 * (short)dst1;
        uStack_b30._6_2_ = uStack_822;
        local_848 = auVar38._0_2_;
        uStack_846 = auVar38._2_2_;
        uStack_844 = auVar38._4_2_;
        uStack_842 = auVar38._6_2_;
        local_b48 = CONCAT22(local_848,local_a48 * (short)res_temp8_4x32b[1]);
        _local_b48 = CONCAT24(sStack_a46 * (short)res_temp8_4x32b[1],local_b48);
        _local_b48 = CONCAT26(uStack_846,_local_b48);
        sStack_b40 = sStack_a44 * (short)res_temp8_4x32b[1];
        uStack_b3e = uStack_844;
        sStack_b3c = sStack_a42 * (short)res_temp8_4x32b[1];
        uStack_b3a = uStack_842;
        iStack_654 = (int)((ulong)local_b58 >> 0x20);
        iStack_650 = local_b58._8_4_;
        iStack_64c = local_b58._12_4_;
        iStack_674 = (int)((ulong)_local_b68 >> 0x20);
        iStack_670 = local_b68._8_4_;
        iStack_66c = local_b68._12_4_;
        iStack_694 = (int)((ulong)local_b38 >> 0x20);
        iStack_690 = local_b38._8_4_;
        iStack_68c = local_b38._12_4_;
        iStack_6b4 = (int)((ulong)_local_b48 >> 0x20);
        iStack_6b0 = local_b48._8_4_;
        iStack_6ac = local_b48._12_4_;
        auVar37 = ZEXT416((uint)res_temp7_4x32b[1]);
        local_b38 = CONCAT44(iStack_694 + iStack_4e4 + iStack_6b4 + iStack_504 + iVar31 >> auVar37,
                             (int)local_b38 + iVar29 + local_b48 + iVar30 + iVar31 >> auVar37);
        uStack_b30._0_4_ = iStack_690 + uStack_af0 + iStack_6b0 + uStack_b00 + iVar31 >> auVar37;
        uStack_b30._4_4_ = iStack_68c + iStack_45c + iStack_6ac + iStack_47c + iVar31 >> auVar37;
        auVar37 = ZEXT416((uint)res_temp7_4x32b[1]);
        local_b58 = CONCAT44(iStack_654 + iStack_4e4 + iStack_674 + iStack_504 + iVar31 >> auVar37,
                             (int)local_b58 + iVar29 + local_b68 + iVar30 + iVar31 >> auVar37);
        uStack_b50._0_4_ = iStack_650 + uStack_af0 + iStack_670 + uStack_b00 + iVar31 >> auVar37;
        uStack_b50._4_4_ = iStack_64c + iStack_45c + iStack_66c + iStack_47c + iVar31 >> auVar37;
        auVar24._8_8_ = uStack_b30;
        auVar24._0_8_ = local_b38;
        auVar23._8_8_ = uStack_b50;
        auVar23._0_8_ = local_b58;
        auVar37 = packssdw(auVar24,auVar23);
        local_238 = auVar37._0_2_;
        sStack_236 = auVar37._2_2_;
        sStack_234 = auVar37._4_2_;
        sStack_232 = auVar37._6_2_;
        sStack_230 = auVar37._8_2_;
        sStack_22e = auVar37._10_2_;
        sStack_22c = auVar37._12_2_;
        sStack_22a = auVar37._14_2_;
        local_b38._0_2_ =
             CONCAT11((0 < sStack_236) * (sStack_236 < 0x100) * auVar37[2] - (0xff < sStack_236),
                      (0 < local_238) * (local_238 < 0x100) * auVar37[0] - (0xff < local_238));
        local_b38._0_3_ =
             CONCAT12((0 < sStack_234) * (sStack_234 < 0x100) * auVar37[4] - (0xff < sStack_234),
                      (undefined2)local_b38);
        local_b38._0_4_ =
             CONCAT13((0 < sStack_232) * (sStack_232 < 0x100) * auVar37[6] - (0xff < sStack_232),
                      (undefined3)local_b38);
        local_b38._0_5_ =
             CONCAT14((0 < sStack_230) * (sStack_230 < 0x100) * auVar37[8] - (0xff < sStack_230),
                      (int)local_b38);
        local_b38._0_6_ =
             CONCAT15((0 < sStack_22e) * (sStack_22e < 0x100) * auVar37[10] - (0xff < sStack_22e),
                      (undefined5)local_b38);
        local_b38._0_7_ =
             CONCAT16((0 < sStack_22c) * (sStack_22c < 0x100) * auVar37[0xc] - (0xff < sStack_22c),
                      (undefined6)local_b38);
        local_b38 = CONCAT17((0 < sStack_22a) * (sStack_22a < 0x100) * auVar37[0xe] -
                             (0xff < sStack_22a),(undefined7)local_b38);
        *(int *)local_a78 = (int)local_b38;
        *(undefined4 *)((long)local_a78 + (long)in_R9D) = local_b38._4_4_;
        local_a68 = (undefined1 (*) [16])(*local_a68 + 8);
        local_a70 = (undefined1 (*) [16])(*local_a70 + 8);
        local_a78 = (undefined8 *)((long)local_a78 + 4);
      }
      local_a68 = (undefined1 (*) [16])
                  ((long)local_a68 +
                  (long)(in_ECX << 1) * 2 + (long)(int)(uint)res_temp5_4x32b[1] * -2);
      local_a70 = (undefined1 (*) [16])
                  ((long)local_a70 +
                  (long)(in_R8D << 1) * 2 + (long)(int)(uint)res_temp5_4x32b[1] * -2);
      local_a78 = (undefined8 *)
                  ((long)local_a78 + ((long)(in_R9D << 1) - (long)(int)(uint)res_temp5_4x32b[1]));
    }
  }
  return;
}

Assistant:

void ihevc_weighted_pred_bi_ssse3(WORD16 *pi2_src1,
                                  WORD16 *pi2_src2,
                                  UWORD8 *pu1_dst,
                                  WORD32 src_strd1,
                                  WORD32 src_strd2,
                                  WORD32 dst_strd,
                                  WORD32 wgt0,
                                  WORD32 off0,
                                  WORD32 wgt1,
                                  WORD32 off1,
                                  WORD32 shift,
                                  WORD32 lvl_shift1,
                                  WORD32 lvl_shift2,
                                  WORD32 ht,
                                  WORD32 wd)
{
    WORD32 row, col, temp;

    __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
    __m128i const_temp_4x32b, lvl_shift1_4x32b, lvl_shift2_4x32b, wgt0_8x16b, wgt1_8x16b;
    __m128i res_temp1_4x32b, res_temp2_4x32b, res_temp3_4x32b, res_temp4_4x32b;

#include <assert.h>
    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 4 == 0); /* checking assumption*/

    temp = (off0 + off1 + 1) << (shift - 1);

    // seting values in register
    lvl_shift1_4x32b = _mm_set1_epi16(lvl_shift1);
    wgt0_8x16b = _mm_set1_epi16(wgt0);
    lvl_shift2_4x32b = _mm_set1_epi16(lvl_shift2);
    wgt1_8x16b = _mm_set1_epi16(wgt1);

    /* lvl_shift1 * wgt0 */
    res_temp1_4x32b = _mm_mullo_epi16(lvl_shift1_4x32b, wgt0_8x16b);
    res_temp2_4x32b = _mm_mulhi_epi16(lvl_shift1_4x32b, wgt0_8x16b);
    /* lvl_shift2 * wgt1 */
    res_temp3_4x32b = _mm_mullo_epi16(lvl_shift2_4x32b, wgt1_8x16b);
    res_temp4_4x32b = _mm_mulhi_epi16(lvl_shift2_4x32b, wgt1_8x16b);

    const_temp_4x32b = _mm_set1_epi32(temp);

    /* lvl_shift1 * wgt0 */
    lvl_shift1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, res_temp2_4x32b);
    /* lvl_shift2 * wgt1 */
    lvl_shift2_4x32b = _mm_unpacklo_epi16(res_temp3_4x32b, res_temp4_4x32b);

    if(0 == (wd & 7)) /* wd multiple of 8 case */
    {
        __m128i res_temp5_4x32b, res_temp6_4x32b, res_temp7_4x32b, res_temp8_4x32b;
        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 2)
        {
            for(col = 0; col < wd; col += 8)
            {
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1)); /* row = 0 */
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2)); /* row = 0 */
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 1 * src_strd1)); /* row = 1 */
                src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 1 * src_strd2)); /* row = 1 */

                /*i4_tmp = (pi2_src[col]) * wgt*/ /* Lower 16 bit */
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                res_temp2_4x32b  = _mm_mullo_epi16(src_temp2_8x16b, wgt1_8x16b);
                res_temp3_4x32b  = _mm_mullo_epi16(src_temp3_8x16b, wgt0_8x16b);
                res_temp4_4x32b  = _mm_mullo_epi16(src_temp4_8x16b, wgt1_8x16b);
                /*i4_tmp = (pi2_src[col] ) * wgt*/ /* Higher 16 bit */
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);
                src_temp2_8x16b  = _mm_mulhi_epi16(src_temp2_8x16b, wgt1_8x16b);
                src_temp3_8x16b  = _mm_mulhi_epi16(src_temp3_8x16b, wgt0_8x16b);
                src_temp4_8x16b  = _mm_mulhi_epi16(src_temp4_8x16b, wgt1_8x16b);

                /* Get 32 bit Result */
                res_temp5_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp6_4x32b = _mm_unpackhi_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp7_4x32b = _mm_unpackhi_epi16(res_temp3_4x32b, src_temp3_8x16b);
                res_temp8_4x32b = _mm_unpackhi_epi16(res_temp4_4x32b, src_temp4_8x16b);

                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp2_4x32b = _mm_unpacklo_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp3_4x32b = _mm_unpacklo_epi16(res_temp3_4x32b, src_temp3_8x16b);
                res_temp4_4x32b = _mm_unpacklo_epi16(res_temp4_4x32b, src_temp4_8x16b);

                /* (pi2_src[col] + lvl_shift) * wgt */
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, lvl_shift1_4x32b);
                res_temp6_4x32b = _mm_add_epi32(res_temp6_4x32b, lvl_shift2_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, lvl_shift1_4x32b);
                res_temp8_4x32b = _mm_add_epi32(res_temp8_4x32b, lvl_shift2_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift1_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift2_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift1_4x32b);
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, lvl_shift2_4x32b);

                /* (pi2_src1[col] + lvl_shift1) * wgt0 + (pi2_src2[col] + lvl_shift2) * wgt1 */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, res_temp2_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, res_temp4_4x32b);
                /* i4_tmp += (off0 + off1 + 1) << (shift - 1); */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, const_temp_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, const_temp_4x32b);
                /* (i4_tmp >> shift) */
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b,  shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b,  shift);

                /* Next 4 Pixels */
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, res_temp6_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, res_temp8_4x32b);
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, const_temp_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, const_temp_4x32b);
                res_temp5_4x32b = _mm_srai_epi32(res_temp5_4x32b,  shift);
                res_temp7_4x32b = _mm_srai_epi32(res_temp7_4x32b,  shift);

                res_temp1_4x32b = _mm_packs_epi32(res_temp1_4x32b, res_temp5_4x32b);
                res_temp3_4x32b = _mm_packs_epi32(res_temp3_4x32b, res_temp7_4x32b);

                /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                res_temp1_4x32b = _mm_packus_epi16(res_temp1_4x32b, res_temp1_4x32b);
                res_temp3_4x32b = _mm_packus_epi16(res_temp3_4x32b, res_temp3_4x32b);

                /* store four 8-bit output values  */
                _mm_storel_epi64((__m128i *)(pu1_dst + 0 * dst_strd), res_temp1_4x32b); /* row = 0*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), res_temp3_4x32b); /* row = 1*/

                pi2_src1 += 8;  /* Pointer update */
                pi2_src2 += 8;  /* Pointer update */
                pu1_dst  += 8;  /* Pointer update */

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src1 = pi2_src1 - wd + 2 * src_strd1;  /* Pointer update */
            pi2_src2 = pi2_src2 - wd + 2 * src_strd2;  /* Pointer update */
            pu1_dst  = pu1_dst  - wd + 2 * dst_strd;   /* Pointer update */

        } /* outer loop ends */
    }
    else /* wd multiple of 4 case */
    {
        WORD32 dst0, dst1;
        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 2)
        {
            for(col = 0; col < wd; col += 4)
            {
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp1_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1)); /* row = 0 */
                src_temp2_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2)); /* row = 0 */
                src_temp3_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + 1 * src_strd1)); /* row = 1 */
                src_temp4_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + 1 * src_strd2)); /* row = 1 */

                /* 2 rows together */
                src_temp1_8x16b = _mm_unpacklo_epi64(src_temp1_8x16b, src_temp3_8x16b);
                src_temp2_8x16b = _mm_unpacklo_epi64(src_temp2_8x16b, src_temp4_8x16b);

                /*i4_tmp = (pi2_src[col]) * wgt*/ /* Lower 16 bit */
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                res_temp2_4x32b  = _mm_mullo_epi16(src_temp2_8x16b, wgt1_8x16b);
                /*i4_tmp = (pi2_src[col] ) * wgt*/ /* Higher 16 bit */
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);
                src_temp2_8x16b  = _mm_mulhi_epi16(src_temp2_8x16b, wgt1_8x16b);

                /* Get 32 bit Result */
                res_temp3_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp4_4x32b = _mm_unpackhi_epi16(res_temp2_4x32b, src_temp2_8x16b);

                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp2_4x32b = _mm_unpacklo_epi16(res_temp2_4x32b, src_temp2_8x16b);

                /* (pi2_src[col] + lvl_shift) * wgt */
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift1_4x32b);
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, lvl_shift2_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift1_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift2_4x32b);

                /* (pi2_src1[col] + lvl_shift1) * wgt0 + (pi2_src2[col] + lvl_shift2) * wgt1 */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, res_temp2_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, res_temp4_4x32b);

                /* i4_tmp += (off0 + off1 + 1) << (shift - 1); */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, const_temp_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, const_temp_4x32b);

                /* (i4_tmp >> shift) */
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b,  shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b,  shift);

                res_temp1_4x32b = _mm_packs_epi32(res_temp1_4x32b, res_temp3_4x32b);

                /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                res_temp1_4x32b = _mm_packus_epi16(res_temp1_4x32b, res_temp1_4x32b);

                dst0 = _mm_cvtsi128_si32(res_temp1_4x32b);

                /* dst row = 1 to 3 */
                res_temp2_4x32b = _mm_shuffle_epi32(res_temp1_4x32b, 1);

                /* store four 8-bit output values  */
                *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0;

                dst1 = _mm_cvtsi128_si32(res_temp2_4x32b);

                /* row = 1 */
                *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1;

                pi2_src1 += 4;  /* Pointer update */
                pi2_src2 += 4;  /* Pointer update */
                pu1_dst  += 4;  /* Pointer update */

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src1 = pi2_src1 - wd + 2 * src_strd1;  /* Pointer update */
            pi2_src2 = pi2_src2 - wd + 2 * src_strd2;  /* Pointer update */
            pu1_dst  = pu1_dst  - wd + 2 * dst_strd;   /* Pointer update */

        } /* outer loop ends */
    }

}